

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMULSM9DS1.cpp
# Opt level: O3

bool __thiscall RTIMULSM9DS1::setCompassCTRL1(RTIMULSM9DS1 *this)

{
  uint uVar1;
  RTIMUSettings *this_00;
  bool bVar2;
  
  this_00 = (this->super_RTIMU).m_settings;
  uVar1 = this_00->m_LSM9DS1CompassSampleRate;
  if (uVar1 < 6) {
    bVar2 = RTIMUHal::HALWrite(&this_00->super_RTIMUHal,this->m_magSlaveAddr,' ',(char)uVar1 << 2,
                               "Failed to set LSM9DS1 compass CTRL5");
    return bVar2;
  }
  fprintf(_stderr,"Illegal LSM9DS1 compass sample rate code %d\n");
  return false;
}

Assistant:

bool RTIMULSM9DS1::setCompassCTRL1()
{
    unsigned char ctrl1;

    if ((m_settings->m_LSM9DS1CompassSampleRate < 0) || (m_settings->m_LSM9DS1CompassSampleRate > 5)) {
        HAL_ERROR1("Illegal LSM9DS1 compass sample rate code %d\n", m_settings->m_LSM9DS1CompassSampleRate);
        return false;
    }

    ctrl1 = (m_settings->m_LSM9DS1CompassSampleRate << 2);

    return m_settings->HALWrite(m_magSlaveAddr, LSM9DS1_MAG_CTRL1, ctrl1, "Failed to set LSM9DS1 compass CTRL5");
}